

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_place(chunk_conflict1 *c,player *p,loc grid)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  _Bool _Var1;
  monster *pmVar2;
  square_conflict *psVar3;
  player *p_local;
  chunk_conflict1 *c_local;
  loc grid_local;
  
  pmVar2 = square_monster((chunk *)c,(loc_conflict)grid);
  if (pmVar2 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                  ,0x71e,"void player_place(struct chunk *, struct player *, struct loc)");
  }
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  _Var1 = square_in_bounds((chunk *)c,grid_00);
  if ((_Var1) &&
     (grid_01.x = (p->grid).x, grid_01.y = (p->grid).y, psVar3 = square((chunk *)c,grid_01),
     psVar3->mon == -1)) {
    grid_02.x = (p->grid).x;
    grid_02.y = (p->grid).y;
    square_set_mon((chunk *)c,grid_02,L'\0');
  }
  p->grid = grid;
  square_set_mon((chunk *)c,(loc_conflict)grid,L'\xffffffff');
  p->upkeep->create_stair = L'\0';
  return;
}

Assistant:

void player_place(struct chunk *c, struct player *p, struct loc grid)
{
	assert(!square_monster(c, grid));

	/* Unmark previous grid */
	if (square_in_bounds(c, p->grid) && (square(c, p->grid)->mon == -1)) {
		square_set_mon(c, p->grid, 0);
	}

	/* Save player location */
	p->grid = grid;

	/* Mark grid */
	square_set_mon(c, grid, -1);

	/* Clear stair creation */
	p->upkeep->create_stair = 0;
}